

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator * __thiscall
QMultiHash<QString,RCCFileInfo*>::emplace_helper<RCCFileInfo*>
          (QMultiHash<QString,_RCCFileInfo_*> *this,QString *key,RCCFileInfo **args)

{
  long lVar1;
  piter it;
  Data<QHashPrivate::MultiNode<QString,_RCCFileInfo_*>_> *in_RCX;
  Data<QHashPrivate::MultiNode<QString,_RCCFileInfo_*>_> *in_RDX;
  iterator *in_RSI;
  iterator *in_RDI;
  long in_FS_OFFSET;
  InsertionResult result;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<QString,_RCCFileInfo_*>_>::findOrInsert<QString>
            (in_RDX,(QString *)in_RCX);
  QHashPrivate::iterator<QHashPrivate::MultiNode<QString,_RCCFileInfo_*>_>::node
            ((iterator<QHashPrivate::MultiNode<QString,_RCCFileInfo_*>_> *)in_RCX);
  QHashPrivate::MultiNode<QString,RCCFileInfo*>::createInPlace<RCCFileInfo*>
            ((MultiNode<QString,_RCCFileInfo_*> *)in_RCX,(QString *)in_RSI,(RCCFileInfo **)in_RDI);
  (in_RSI->i).bucket = (in_RSI->i).bucket + 1;
  it.bucket = (size_t)in_RDX;
  it.d = in_RCX;
  QMultiHash<QString,_RCCFileInfo_*>::iterator::iterator(in_RSI,it,(Chain **)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&...args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->insertMulti(std::forward<Args>(args)...);
        ++m_size;
        return iterator(result.it);
    }